

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.H
# Opt level: O0

double amrex::detail::bisect_prob_hi<double>(Real plo,Real phi,Real idx,int ilo,int ihi,Real tol)

{
  bool bVar1;
  int in_ESI;
  int iVar2;
  literals *in_RDI;
  undefined1 *puVar3;
  double in_XMM0_Qa;
  double dVar4;
  Real RVar5;
  anon_class_24_4_3035a155 *extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double mid;
  double lo;
  int i;
  bool safe;
  double hi;
  int n;
  double fmi;
  double mi;
  double fhi;
  double flo;
  double in_stack_fffffffffffffee8;
  anon_class_24_4_3035a155 *in_stack_fffffffffffffef0;
  anon_class_24_4_3035a155 *this;
  double local_88;
  undefined1 local_80 [16];
  undefined8 local_70;
  int local_64;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  int local_3c;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  int local_14;
  double local_10;
  double local_8;
  
  iVar2 = (int)in_RDI;
  local_88 = in_XMM1_Qa - in_XMM3_Qa;
  dVar4 = floor((local_88 - in_XMM0_Qa) * in_XMM2_Qa);
  if ((int)dVar4 + iVar2 < iVar2 || in_ESI < (int)dVar4 + iVar2) {
    RVar5 = literals::operator____rt(in_RDI,(longdouble)0.5);
    local_28 = in_XMM1_Qa - RVar5 / in_XMM2_Qa;
    local_70 = CONCAT44(in_ESI,iVar2);
    local_3c = 100;
    local_38 = in_XMM3_Qa;
    local_30 = local_88;
    local_48 = bisect_prob_hi<double>::anon_class_24_4_3035a155::operator()
                         (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    puVar3 = local_80;
    local_50 = bisect_prob_hi<double>::anon_class_24_4_3035a155::operator()
                         (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if ((local_48 != 0.0) || (NAN(local_48))) {
      if ((local_50 != 0.0) || (local_20 = local_50, NAN(local_50))) {
        local_58 = (local_28 + local_30) / 2.0;
        local_60 = 0.0;
        local_64 = 1;
        while ((iVar2 = (int)puVar3, local_64 <= local_3c && (local_38 <= local_30 - local_28))) {
          local_8 = local_28;
          local_10 = local_30;
          local_14 = 2;
          std::abs(iVar2);
          this = extraout_XMM0_Qa;
          dVar4 = std::numeric_limits<double>::epsilon();
          std::abs(iVar2);
          bVar1 = true;
          if (dVar4 * extraout_XMM0_Qa_00 * (double)local_14 < (double)this) {
            std::abs(iVar2);
            in_stack_fffffffffffffee8 = extraout_XMM0_Qa_01;
            dVar4 = std::numeric_limits<double>::min();
            bVar1 = in_stack_fffffffffffffee8 < dVar4;
          }
          if (bVar1) break;
          local_58 = (local_28 + local_30) / 2.0;
          local_60 = bisect_prob_hi<double>::anon_class_24_4_3035a155::operator()
                               (this,in_stack_fffffffffffffee8);
          if ((local_60 == 0.0) && (!NAN(local_60))) break;
          if (0.0 <= local_60 * local_48) {
            local_28 = local_58;
          }
          else {
            local_30 = local_58;
          }
          local_48 = bisect_prob_hi<double>::anon_class_24_4_3035a155::operator()
                               (this,in_stack_fffffffffffffee8);
          puVar3 = local_80;
          local_50 = bisect_prob_hi<double>::anon_class_24_4_3035a155::operator()
                               (this,in_stack_fffffffffffffee8);
          local_64 = local_64 + 1;
        }
        local_20 = local_58;
      }
    }
    else {
      local_20 = local_48;
    }
    local_88 = local_20 - in_XMM3_Qa;
  }
  return local_88;
}

Assistant:

T bisect_prob_hi (amrex::Real plo, amrex::Real phi, amrex::Real idx, int ilo, int ihi, amrex::Real tol) {
            T hi = static_cast<T>(phi - tol);
            bool safe;
            {
                int i = int(Math::floor((hi - plo)*idx)) + ilo;
                safe = i >= ilo && i <= ihi;
            }
            if (safe) {
                return hi;
            } else {
                // bisect the point at which the cell no longer maps to inside the domain
                T lo = static_cast<T>(phi - 0.5_rt/idx);
                T mid = bisect(lo, hi,
                               [=] AMREX_GPU_HOST_DEVICE (T x) -> T
                                   {
                                       int i = int(Math::floor((x - plo)*idx)) + ilo;
                                       bool inside = i >= ilo && i <= ihi;
                                       return static_cast<T>(inside) - T(0.5);
                                   }, static_cast<T>(tol));
                return mid - static_cast<T>(tol);
            }
        }